

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Catch.h
# Opt level: O0

void __thiscall
Catch::RegistrarForTagAliases::RegistrarForTagAliases
          (RegistrarForTagAliases *this,char *alias,char *tag,SourceLineInfo *lineInfo)

{
  Colour colourGuard;
  exception *ex;
  SourceLineInfo *in_stack_00000618;
  char *in_stack_00000620;
  char *in_stack_00000628;
  TagAliasRegistry *in_stack_00000630;
  
  TagAliasRegistry::get();
  TagAliasRegistry::add(in_stack_00000630,in_stack_00000628,in_stack_00000620,in_stack_00000618);
  return;
}

Assistant:

RegistrarForTagAliases::RegistrarForTagAliases( char const* alias, char const* tag, SourceLineInfo const& lineInfo ) {
        try {
            TagAliasRegistry::get().add( alias, tag, lineInfo );
        }
        catch( std::exception& ex ) {
            Colour colourGuard( Colour::Red );
            std::cerr << ex.what() << std::endl;
            exit(1);
        }
    }